

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  uint uVar2;
  jx9_user_func *pjVar3;
  jx9_io_stream *pStream;
  io_private *pDev;
  jx9_value *pjVar4;
  jx9_value *pVal;
  void *pvVar5;
  jx9_int64 jVar6;
  char *pcVar7;
  ushort **ppuVar8;
  char *pcVar9;
  sxi32 iErr;
  jx9_vm *pVm;
  jx9_value *pResource;
  char *pcVar10;
  SyBlob *pBlob;
  uint local_6c;
  char *zBuf;
  io_private *local_48;
  char *zFile;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar3 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar9 = "Expecting a file path";
LAB_0013d84b:
    iErr = 2;
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pjVar3 = pCtx->pFunc;
      pcVar9 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013d84b;
    }
    local_6c = 0;
    pDev = (io_private *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
    pVm = pCtx->pVm;
    if (pDev != (io_private *)0x0) {
      pDev->pStream = pStream;
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).nByte = 0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).pAllocator = &pVm->sAllocator;
      (pDev->sBuffer).nFlags = 0;
      pDev->nOfft = 0;
      pDev->iMagic = 0xfeac14;
      if (nArg != 1) {
        pjVar4 = apArg[1];
        jx9MemObjToInteger(pjVar4);
        local_6c = *(uint *)&pjVar4->x;
      }
      pjVar4 = jx9_context_new_array(pCtx);
      pVal = jx9_context_new_scalar(pCtx);
      pcVar9 = zFile;
      pVm = pCtx->pVm;
      if (pVal != (jx9_value *)0x0 && pjVar4 != (jx9_value *)0x0) {
        if ((uint)nArg < 3) {
          pResource = (jx9_value *)0x0;
        }
        else {
          pResource = apArg[2];
        }
        pvVar5 = jx9StreamOpenHandle(pVm,pStream,zFile,1,local_6c & 1,pResource,0,(int *)0x0);
        pDev->pHandle = pvVar5;
        local_48 = pDev;
        if (pvVar5 != (void *)0x0) {
LAB_0013d9eb:
          do {
            jVar6 = StreamReadLine(pDev,&zBuf,-1);
            pcVar9 = zBuf;
            if (jVar6 < 1) {
              pBlob = &local_48->sBuffer;
              if (pStream->xClose != (_func_void_void_ptr *)0x0) {
                (*pStream->xClose)(pDev->pHandle);
              }
              SyBlobRelease(pBlob);
              pDev->iMagic = 0x2126;
              jx9_context_free_chunk(pCtx,pDev);
              jx9_result_value(pCtx,pjVar4);
              return 0;
            }
            (pVal->sBlob).nByte = 0;
            uVar2 = (pVal->sBlob).nFlags;
            if ((uVar2 & 4) != 0) {
              (pVal->sBlob).pBlob = (void *)0x0;
              (pVal->sBlob).mByte = 0;
              (pVal->sBlob).nFlags = uVar2 & 0xfffffffb;
            }
            pcVar7 = zBuf + jVar6;
            pcVar10 = pcVar7;
            if ((local_6c & 2) != 0) {
              do {
                pcVar7 = pcVar10;
                if (pcVar7 <= zBuf) break;
                pcVar10 = pcVar7 + -1;
              } while (pcVar7[-1] == '\n');
            }
            if ((local_6c & 4) == 0) {
LAB_0013da52:
              jx9_value_string(pVal,pcVar9,(int)pcVar7 - (int)pcVar9);
              if ((pjVar4->iFlags & 0x40) != 0) {
                HashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,(jx9_value *)0x0,pVal);
              }
              goto LAB_0013d9eb;
            }
            pcVar10 = zBuf;
            if (zBuf < pcVar7) {
              do {
                cVar1 = *pcVar10;
                if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
                   (ppuVar8 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 0x20) == 0))
                goto LAB_0013da52;
                pcVar10 = pcVar10 + 1;
              } while (pcVar10 != pcVar7);
            }
          } while( true );
        }
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar9);
        goto LAB_0013d855;
      }
    }
    pjVar3 = pCtx->pFunc;
    pcVar9 = "JX9 is running out of memory";
    iErr = 1;
  }
  jx9VmThrowError(pVm,&pjVar3->sName,iErr,pcVar9);
LAB_0013d855:
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFile, *zPtr, *zEnd, *zBuf;
	jx9_value *pArray, *pLine;
	const jx9_io_stream *pStream;
	int use_include = 0;
	io_private *pDev;
	jx9_int64 n;
	int iFlags;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	iFlags = 0;
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
	}
	if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/ ){
		use_include = TRUE;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pLine = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pLine == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		/* Don't worry about freeing memory, everything will be released automatically
		 * as soon we return from this function.
		 */
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Try to extract a line */
		n = StreamReadLine(pDev, &zBuf, -1);
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pLine);
		/* Remove line ending if requested by the caller */
		zPtr = zBuf;
		zEnd = &zBuf[n];
		if( iFlags & 0x02 /* FILE_IGNORE_NEW_LINES */ ){
			/* Ignore trailig lines */
			while( zPtr < zEnd && (zEnd[-1] == '\n' 
#ifdef __WINNT__
				|| zEnd[-1] == '\r'
#endif
				)){
					n--;
					zEnd--;
			}
		}
		if( iFlags & 0x04 /* FILE_SKIP_EMPTY_LINES */ ){
			/* Ignore empty lines */
			while( zPtr < zEnd && (unsigned char)zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* Empty line */
				continue;
			}
		}
		jx9_value_string(pLine, zBuf, (int)(zEnd-zBuf));
		/* Insert line */
		jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pLine);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pDev->pHandle);
	/* Release the io_private instance */
	ReleaseIOPrivate(pCtx, pDev);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}